

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_reply.c
# Opt level: O3

int tnt_reply_from(tnt_reply *r,tnt_reply_t rcv,void *ptr)

{
  ushort *puVar1;
  byte bVar2;
  ulong uVar3;
  bool bVar4;
  size_t *psVar5;
  size_t *psVar6;
  size_t *psVar7;
  int iVar8;
  uint uVar9;
  ssize_t sVar10;
  char *pcVar11;
  size_t *psVar12;
  size_t *psVar13;
  size_t *psVar14;
  size_t *psVar15;
  uint *in_RCX;
  size_t *psVar16;
  ulong uVar17;
  long lVar18;
  long extraout_RDX;
  long extraout_RDX_00;
  size_t size;
  undefined8 unaff_RBX;
  byte *pbVar19;
  size_t *end;
  int64_t iVar20;
  void *pvVar21;
  byte **data;
  tnt_reply *r_00;
  ulong uVar22;
  ulong uVar23;
  size_t size_00;
  ulong unaff_R13;
  size_t *psStack_160;
  size_t *psStack_158;
  size_t sStack_148;
  size_t sStack_140;
  size_t *psStack_138;
  size_t *psStack_130;
  byte **ppbStack_128;
  code *pcStack_120;
  size_t *psStack_118;
  size_t *psStack_110;
  byte **ppbStack_108;
  size_t *psStack_100;
  size_t *psStack_f8;
  size_t *psStack_f0;
  size_t *psStack_e8;
  size_t *psStack_e0;
  size_t *psStack_d8;
  ulong uStack_d0;
  ulong uStack_c8;
  ulong uStack_c0;
  size_t *psStack_b8;
  uint *puStack_b0;
  ulong uStack_a8;
  ulong uStack_a0;
  byte *pbStack_98;
  void *pvStack_90;
  code *apcStack_88 [2];
  byte *pbStack_78;
  uint *puStack_70;
  tnt_reply *ptStack_68;
  ulong uStack_60;
  code *pcStack_40;
  size_t local_38;
  size_t hdr_length;
  undefined4 uStack_28;
  char length [5];
  
  uStack_28 = (undefined4)unaff_RBX;
  length._1_4_ = (undefined4)((ulong)unaff_RBX >> 0x20);
  *(undefined8 *)r = 0;
  r->bitmap = 0;
  r->buf = (char *)0x0;
  r->buf_size = 0;
  r->code = 0;
  r->sync = 0;
  r->schema_id = 0;
  r->error = (char *)0x0;
  r->error_end = (char *)0x0;
  r->data = (char *)0x0;
  r->data_end = (char *)0x0;
  r->metadata = (char *)0x0;
  r->metadata_end = (char *)0x0;
  r->sqlinfo = (char *)0x0;
  r->sqlinfo_end = (char *)0x0;
  r->alloc = r->alloc;
  pbVar19 = (byte *)((long)&hdr_length + 3);
  pcStack_40 = (code *)0x10a6fe;
  pvVar21 = ptr;
  sVar10 = (*rcv)(ptr,(char *)pbVar19,5);
  if ((sVar10 != -1) && (size_00 = (size_t)hdr_length._3_1_, mp_type_hint[size_00] == MP_UINT)) {
    switch(hdr_length._3_1_) {
    case 0xcc:
      size_00 = (size_t)hdr_length._4_1_;
      break;
    case 0xcd:
      size_00 = (size_t)(ushort)(CONCAT11(hdr_length._5_1_,hdr_length._4_1_) << 8 |
                                (ushort)hdr_length._5_1_);
      break;
    case 0xce:
      size_00 = (size_t)((uint)(hdr_length._6_2_ >> 8) | ((hdr_length._6_2_ & 0xff) << 0x10) >> 8 |
                         (CONCAT11(hdr_length._5_1_,hdr_length._4_1_) & 0xff00) << 8 |
                        CONCAT22(hdr_length._6_2_,CONCAT11(hdr_length._5_1_,hdr_length._4_1_)) <<
                        0x18);
      break;
    case 0xcf:
      uVar9 = CONCAT22(hdr_length._6_2_,CONCAT11(hdr_length._5_1_,hdr_length._4_1_));
      size_00 = (ulong)((uint)uStack_28 >> 0x18) |
                (((ulong)(uint)uStack_28 & 0xff0000) << 0x20) >> 0x28 |
                (((ulong)(uint)uStack_28 & 0xff00) << 0x20) >> 0x18 |
                (((ulong)(uint)uStack_28 & 0xff) << 0x20) >> 8 | ((ulong)uVar9 & 0xff000000) << 8 |
                ((ulong)uVar9 & 0xff0000) << 0x18 | ((ulong)uVar9 & 0xff00) << 0x28 |
                CONCAT44(uStack_28,uVar9) << 0x38;
      break;
    default:
      if ((char)hdr_length._3_1_ < '\0') {
        pcStack_40 = tnt_reply_hdr0;
        tnt_reply_from_cold_1();
        data = &pbStack_78;
        apcStack_88[0] = (code *)0x10a854;
        pbStack_78 = pbVar19;
        ptStack_68 = r;
        uStack_60 = size_00;
        pcStack_40 = (code *)&stack0xfffffffffffffff8;
        uVar9 = mp_check((char **)data,(char *)(pbVar19 + extraout_RDX));
        psVar16 = (size_t *)(ulong)uVar9;
        iVar8 = -1;
        if (uVar9 == 0) {
          bVar2 = *pbVar19;
          psVar15 = (size_t *)(ulong)bVar2;
          if (mp_type_hint[(long)psVar15] != MP_MAP) {
            return -1;
          }
          if (bVar2 == 0xdf) {
            uVar9 = *(uint *)(pbVar19 + 1);
            psVar15 = (size_t *)
                      (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                             uVar9 << 0x18);
            psVar16 = (size_t *)(pbVar19 + 5);
          }
          else if (bVar2 == 0xde) {
            psVar16 = (size_t *)(pbVar19 + 3);
            psVar15 = (size_t *)
                      (ulong)(ushort)(*(ushort *)(pbVar19 + 1) << 8 | *(ushort *)(pbVar19 + 1) >> 8)
            ;
          }
          else {
            if (-0x71 < (char)bVar2) {
LAB_0010aaf3:
              apcStack_88[0] = tnt_reply_body0;
              tnt_reply_hdr0_cold_5();
              end = (size_t *)((long)psVar15 + extraout_RDX_00);
              pcStack_120 = (code *)0x10ab24;
              psVar13 = psVar16;
              psStack_118 = psVar15;
              puStack_b0 = in_RCX;
              uStack_a8 = size_00;
              uStack_a0 = unaff_R13;
              pbStack_98 = pbVar19;
              pvStack_90 = pvVar21;
              apcStack_88[0] = (code *)&pcStack_40;
              iVar8 = mp_check((char **)&psStack_118,(char *)end);
              r_00 = (tnt_reply *)0xffffffff;
              if ((iVar8 == 0) && (bVar2 = (byte)*psVar15, mp_type_hint[bVar2] == MP_MAP)) {
                psStack_b8 = (size_t *)((long)psVar15 + 1);
                if (bVar2 == 0xdf) {
                  uVar9 = *(uint *)((long)psVar15 + 1);
                  uVar22 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                                  uVar9 << 0x18);
                  psStack_b8 = (size_t *)((long)psVar15 + 5);
                }
                else if (bVar2 == 0xde) {
                  psStack_b8 = (size_t *)((long)psVar15 + 3);
                  uVar22 = (ulong)(ushort)(*(ushort *)((long)psVar15 + 1) << 8 |
                                          *(ushort *)((long)psVar15 + 1) >> 8);
                }
                else {
                  if (-0x71 < (char)bVar2) {
LAB_0010b08a:
                    pcStack_120 = tnt_reply;
                    tnt_reply_body0_cold_3();
                    psStack_138 = psVar16;
                    psStack_130 = psVar15;
                    ppbStack_128 = data;
                    pcStack_120 = (code *)apcStack_88;
                    iVar8 = tnt_reply_len((char *)end,size,&sStack_140);
                    sStack_148 = sStack_140;
                    if (iVar8 == 0) {
                      if (r_00 == (tnt_reply *)0x0) {
                        iVar8 = 0;
                      }
                      else {
                        psStack_158 = &sStack_148;
                        sStack_148 = 0;
                        psStack_160 = end;
                        iVar8 = tnt_reply_from(r_00,tnt_reply_cb,&psStack_160);
                      }
                    }
                    else {
                      if (iVar8 != 1) {
                        return -1;
                      }
                      iVar8 = 1;
                    }
                    if (psVar13 != (size_t *)0x0) {
                      *psVar13 = sStack_148;
                    }
                    return iVar8;
                  }
                  uVar22 = (ulong)(bVar2 & 0xf);
                }
                psStack_110 = psVar16;
                ppbStack_108 = data;
                psStack_100 = psVar15;
                if ((int)uVar22 == 0) {
                  end = (size_t *)0x0;
                  psStack_f8 = (size_t *)0x0;
                  psStack_f0 = (size_t *)0x0;
                  psVar14 = (size_t *)0x0;
                  psStack_e8 = (size_t *)0x0;
                  psVar15 = (size_t *)0x0;
                  psStack_e0 = (size_t *)0x0;
                  psVar16 = (size_t *)0x0;
                  uVar23 = 0;
                }
                else {
                  uVar23 = 0;
                  psVar16 = (size_t *)0x0;
                  psStack_e0 = (size_t *)0x0;
                  psVar15 = (size_t *)0x0;
                  psStack_e8 = (size_t *)0x0;
                  psVar14 = (size_t *)0x0;
                  psStack_f0 = (size_t *)0x0;
                  psStack_f8 = (size_t *)0x0;
                  end = (size_t *)0x0;
                  do {
                    r_00 = (tnt_reply *)0xffffffff;
                    bVar2 = (byte)*psStack_b8;
                    uVar17 = (ulong)bVar2;
                    psVar12 = (size_t *)((long)psStack_b8 + 1);
                    psVar13 = (size_t *)(ulong)(bVar2 - 0xcc);
                    switch(psVar13) {
                    case (size_t *)0x0:
                      uVar17 = (ulong)*(byte *)((long)psStack_b8 + 1);
                      psVar12 = (size_t *)((long)psStack_b8 + 2);
                      break;
                    case (size_t *)0x1:
                      psVar12 = (size_t *)((long)psStack_b8 + 3);
                      uVar17 = (ulong)(ushort)(*(ushort *)((long)psStack_b8 + 1) << 8 |
                                              *(ushort *)((long)psStack_b8 + 1) >> 8);
                      break;
                    case (size_t *)0x2:
                      uVar9 = *(uint *)((long)psStack_b8 + 1);
                      uVar17 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 |
                                       (uVar9 & 0xff00) << 8 | uVar9 << 0x18);
                      psVar12 = (size_t *)((long)psStack_b8 + 5);
                      break;
                    case (size_t *)0x3:
                      uVar17 = *(ulong *)((long)psStack_b8 + 1);
                      uVar17 = uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 |
                               (uVar17 & 0xff0000000000) >> 0x18 | (uVar17 & 0xff00000000) >> 8 |
                               (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 |
                               (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38;
                      psVar12 = (size_t *)((long)psStack_b8 + 9);
                      break;
                    default:
                      if (-1 < (char)bVar2) break;
                      pcStack_120 = (code *)0x10b085;
                      psStack_b8 = psVar12;
                      tnt_reply_body0_cold_2();
                      goto LAB_0010b085;
                    }
                    iVar8 = (int)uVar17;
                    psStack_b8 = psVar12;
                    psVar5 = psStack_f0;
                    psVar6 = psStack_e8;
                    psVar7 = psStack_e0;
                    if (iVar8 < 0x32) {
                      if (iVar8 == 0x30) {
                        if (mp_type_hint[(byte)*psVar12] != MP_ARRAY) goto LAB_0010b06f;
                        iVar20 = 1;
                        do {
                          psVar14 = (size_t *)((long)psStack_b8 + 1);
                          lVar18 = (long)""[(byte)*psStack_b8];
                          psVar5 = psVar12;
                          if (lVar18 < 0) {
                            if ((byte)*psStack_b8 == 0xd9) {
                              psVar14 = (size_t *)
                                        ((long)psStack_b8 +
                                        (ulong)*(byte *)((long)psStack_b8 + 1) + 2);
                            }
                            else {
                              if ((byte)""[(byte)*psStack_b8] < 0xe1) {
                                pcStack_120 = (code *)0x10afac;
                                psStack_d8 = end;
                                uStack_d0 = uVar17;
                                uStack_c8 = uVar22;
                                uStack_c0 = uVar23;
                                mp_next_slowpath((char **)&psStack_b8,iVar20);
                                uVar17 = uStack_d0;
                                end = psStack_d8;
                                uVar22 = uStack_c8;
                                uVar23 = uStack_c0;
                                psVar14 = psStack_b8;
                                psVar6 = psStack_e8;
                                psVar7 = psStack_e0;
                                break;
                              }
                              iVar20 = iVar20 - lVar18;
                              uStack_c8 = uVar22;
                              uStack_c0 = uVar23;
                            }
                          }
                          else {
                            psVar14 = (size_t *)((long)psVar14 + lVar18);
                          }
                          bVar4 = 1 < iVar20;
                          iVar20 = iVar20 + -1;
                          psStack_b8 = psVar14;
                          psStack_d8 = end;
                          uStack_d0 = uVar17;
                        } while (bVar4);
                      }
                      else if (iVar8 == 0x31) {
                        bVar2 = (byte)*psVar12;
                        if (mp_type_hint[bVar2] != MP_STR) goto LAB_0010b06f;
                        end = (size_t *)((long)psVar12 + 1);
                        if (bVar2 == 0xdb) {
                          uVar9 = *(uint *)((long)psVar12 + 1);
                          uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                                  uVar9 << 0x18;
                          end = (size_t *)((long)psVar12 + 5);
                        }
                        else if (bVar2 == 0xda) {
                          end = (size_t *)((long)psVar12 + 3);
                          uVar9 = (uint)(ushort)(*(ushort *)((long)psVar12 + 1) << 8 |
                                                *(ushort *)((long)psVar12 + 1) >> 8);
                        }
                        else if (bVar2 == 0xd9) {
                          uVar9 = (uint)*(byte *)((long)psVar12 + 1);
                          end = (size_t *)((long)psVar12 + 2);
                        }
                        else {
                          psVar13 = (size_t *)(ulong)(bVar2 + 0x40);
                          psStack_b8 = end;
                          if ((byte)(bVar2 + 0x40) < 0xe0) {
LAB_0010b085:
                            pcStack_120 = (code *)0x10b08a;
                            tnt_reply_body0_cold_1();
                            data = (byte **)"";
                            goto LAB_0010b08a;
                          }
                          uVar9 = bVar2 & 0x1f;
                        }
                        psStack_f8 = (size_t *)((ulong)uVar9 + (long)end);
                        psStack_b8 = psStack_f8;
                      }
                      else {
LAB_0010ad5b:
                        iVar20 = 1;
                        do {
                          psVar13 = (size_t *)((long)psStack_b8 + 1);
                          lVar18 = (long)""[(byte)*psStack_b8];
                          if (lVar18 < 0) {
                            if ((byte)*psStack_b8 == 0xd9) {
                              psVar13 = (size_t *)
                                        ((long)psStack_b8 +
                                        (ulong)*(byte *)((long)psStack_b8 + 1) + 2);
                            }
                            else {
                              if ((byte)""[(byte)*psStack_b8] < 0xe1) {
                                pcStack_120 = (code *)0x10af7c;
                                psStack_d8 = end;
                                uStack_d0 = uVar17;
                                uStack_c8 = uVar22;
                                uStack_c0 = uVar23;
                                mp_next_slowpath((char **)&psStack_b8,iVar20);
                                uVar17 = uStack_d0;
                                end = psStack_d8;
                                uVar22 = uStack_c8;
                                uVar23 = uStack_c0;
                                psVar5 = psStack_f0;
                                psVar6 = psStack_e8;
                                psVar7 = psStack_e0;
                                break;
                              }
                              iVar20 = iVar20 - lVar18;
                              uStack_c8 = uVar22;
                              uStack_c0 = uVar23;
                            }
                          }
                          else {
                            psVar13 = (size_t *)((long)psVar13 + lVar18);
                          }
                          bVar4 = 1 < iVar20;
                          iVar20 = iVar20 + -1;
                          psStack_b8 = psVar13;
                          psStack_d8 = end;
                          uStack_d0 = uVar17;
                        } while (bVar4);
                      }
                    }
                    else if (iVar8 == 0x32) {
                      if (mp_type_hint[(byte)*psVar12] != MP_ARRAY) goto LAB_0010b06f;
                      iVar20 = 1;
                      do {
                        psVar15 = (size_t *)((long)psStack_b8 + 1);
                        lVar18 = (long)""[(byte)*psStack_b8];
                        psVar6 = psVar12;
                        if (lVar18 < 0) {
                          if ((byte)*psStack_b8 == 0xd9) {
                            psVar15 = (size_t *)
                                      ((long)psStack_b8 + (ulong)*(byte *)((long)psStack_b8 + 1) + 2
                                      );
                          }
                          else {
                            if ((byte)""[(byte)*psStack_b8] < 0xe1) {
                              pcStack_120 = (code *)0x10afc8;
                              psStack_d8 = end;
                              uStack_d0 = uVar17;
                              uStack_c8 = uVar22;
                              uStack_c0 = uVar23;
                              mp_next_slowpath((char **)&psStack_b8,iVar20);
                              uVar17 = uStack_d0;
                              end = psStack_d8;
                              uVar22 = uStack_c8;
                              uVar23 = uStack_c0;
                              psVar15 = psStack_b8;
                              psVar5 = psStack_f0;
                              psVar7 = psStack_e0;
                              break;
                            }
                            iVar20 = iVar20 - lVar18;
                            uStack_c8 = uVar22;
                            uStack_c0 = uVar23;
                          }
                        }
                        else {
                          psVar15 = (size_t *)((long)psVar15 + lVar18);
                        }
                        bVar4 = 1 < iVar20;
                        iVar20 = iVar20 + -1;
                        psStack_b8 = psVar15;
                        psStack_d8 = end;
                        uStack_d0 = uVar17;
                      } while (bVar4);
                    }
                    else {
                      if (iVar8 != 0x42) goto LAB_0010ad5b;
                      if (mp_type_hint[(byte)*psVar12] != MP_MAP) goto LAB_0010b06f;
                      iVar20 = 1;
                      do {
                        psVar16 = (size_t *)((long)psStack_b8 + 1);
                        lVar18 = (long)""[(byte)*psStack_b8];
                        psVar7 = psVar12;
                        if (lVar18 < 0) {
                          if ((byte)*psStack_b8 == 0xd9) {
                            psVar16 = (size_t *)
                                      ((long)psStack_b8 + (ulong)*(byte *)((long)psStack_b8 + 1) + 2
                                      );
                          }
                          else {
                            if ((byte)""[(byte)*psStack_b8] < 0xe1) {
                              pcStack_120 = (code *)0x10af90;
                              psStack_d8 = end;
                              uStack_d0 = uVar17;
                              uStack_c8 = uVar22;
                              uStack_c0 = uVar23;
                              mp_next_slowpath((char **)&psStack_b8,iVar20);
                              uVar17 = uStack_d0;
                              psVar16 = psStack_b8;
                              end = psStack_d8;
                              uVar22 = uStack_c8;
                              uVar23 = uStack_c0;
                              psVar5 = psStack_f0;
                              psVar6 = psStack_e8;
                              break;
                            }
                            iVar20 = iVar20 - lVar18;
                            uStack_c8 = uVar22;
                            uStack_c0 = uVar23;
                          }
                        }
                        else {
                          psVar16 = (size_t *)((long)psVar16 + lVar18);
                        }
                        bVar4 = 1 < iVar20;
                        psStack_b8 = psVar16;
                        iVar20 = iVar20 + -1;
                        psStack_d8 = end;
                        uStack_d0 = uVar17;
                      } while (bVar4);
                    }
                    psStack_e0 = psVar7;
                    psStack_e8 = psVar6;
                    psStack_f0 = psVar5;
                    uVar9 = (int)uVar22 - 1;
                    uVar22 = (ulong)uVar9;
                    uVar23 = uVar23 | 1L << (uVar17 & 0x3f);
                  } while (uVar9 != 0);
                }
                if (ppbStack_108 != (byte **)0x0) {
                  ppbStack_108[7] = (byte *)end;
                  ppbStack_108[8] = (byte *)psStack_f8;
                  ppbStack_108[9] = (byte *)psStack_f0;
                  ppbStack_108[10] = (byte *)psVar14;
                  ppbStack_108[0xb] = (byte *)psStack_e8;
                  ppbStack_108[0xc] = (byte *)psVar15;
                  ppbStack_108[0xd] = (byte *)psStack_e0;
                  ppbStack_108[0xe] = (byte *)psVar16;
                  ppbStack_108[1] = (byte *)((ulong)ppbStack_108[1] | uVar23);
                }
                r_00 = (tnt_reply *)0x0;
                if (psStack_110 != (size_t *)0x0) {
                  *psStack_110 = (long)psStack_b8 - (long)psStack_100;
                }
              }
LAB_0010b06f:
              return (int)r_00;
            }
            psVar16 = (size_t *)(pbVar19 + 1);
            psVar15 = (size_t *)(ulong)(bVar2 & 0xf);
          }
          puStack_70 = in_RCX;
          if ((int)psVar15 == 0) {
            unaff_R13 = 0;
            uVar23 = 0;
            uVar22 = 0;
            data = (byte **)0x0;
          }
          else {
            data = (byte **)0x0;
            uVar22 = 0;
            uVar23 = 0;
            unaff_R13 = 0;
            do {
              bVar2 = (byte)*psVar16;
              uVar17 = (ulong)bVar2;
              if (mp_type_hint[uVar17] != MP_UINT) {
                return -1;
              }
              size_00 = (size_t)(bVar2 - 0xcc);
              switch(size_00) {
              case 0:
                uVar17 = (ulong)*(byte *)((long)psVar16 + 1);
                psVar16 = (size_t *)((long)psVar16 + 2);
                break;
              case 1:
                puVar1 = (ushort *)((long)psVar16 + 1);
                psVar16 = (size_t *)((long)psVar16 + 3);
                uVar17 = (ulong)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
                break;
              case 2:
                uVar9 = *(uint *)((long)psVar16 + 1);
                uVar17 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                                uVar9 << 0x18);
                psVar16 = (size_t *)((long)psVar16 + 5);
                break;
              case 3:
                uVar17 = *(ulong *)((long)psVar16 + 1);
                uVar17 = uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 |
                         (uVar17 & 0xff0000000000) >> 0x18 | (uVar17 & 0xff00000000) >> 8;
                psVar16 = (size_t *)((long)psVar16 + 9);
                break;
              default:
                if (-1 < (char)bVar2) {
                  psVar16 = (size_t *)((long)psVar16 + 1);
                  break;
                }
                apcStack_88[0] = (code *)0x10aae4;
                tnt_reply_hdr0_cold_4();
                goto LAB_0010aae4;
              }
              bVar2 = (byte)*psVar16;
              size_00 = (size_t)bVar2;
              if (mp_type_hint[size_00] != MP_UINT) {
                return -1;
              }
              iVar8 = (int)uVar17;
              if (iVar8 == 0) {
                switch(bVar2) {
                case 0xcc:
                  uVar23 = (ulong)*(byte *)((long)psVar16 + 1);
                  goto LAB_0010a9e0;
                case 0xcd:
                  puVar1 = (ushort *)((long)psVar16 + 1);
                  psVar16 = (size_t *)((long)psVar16 + 3);
                  uVar23 = (ulong)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
                  break;
                case 0xce:
                  uVar23 = (ulong)(*(uint *)((long)psVar16 + 1) >> 0x18 |
                                  (*(uint *)((long)psVar16 + 1) & 0xff0000) >> 8);
                  goto LAB_0010aa1f;
                case 0xcf:
                  uVar23 = *(ulong *)((long)psVar16 + 1) >> 0x38 |
                           (*(ulong *)((long)psVar16 + 1) & 0xff000000000000) >> 0x28;
                  goto LAB_0010aa49;
                default:
                  if ((char)bVar2 < '\0') {
LAB_0010aae9:
                    apcStack_88[0] = (code *)0x10aaee;
                    tnt_reply_hdr0_cold_2();
LAB_0010aaee:
                    apcStack_88[0] = (code *)0x10aaf3;
                    tnt_reply_hdr0_cold_3();
                    in_RCX = &switchD_0010a984::switchdataD_0011f664;
                    goto LAB_0010aaf3;
                  }
                  psVar16 = (size_t *)((long)psVar16 + 1);
                  uVar23 = size_00;
                }
              }
              else if (iVar8 == 5) {
                switch(bVar2) {
                case 0xcc:
                  uVar22 = (ulong)*(byte *)((long)psVar16 + 1);
                  goto LAB_0010a9e0;
                case 0xcd:
                  puVar1 = (ushort *)((long)psVar16 + 1);
                  psVar16 = (size_t *)((long)psVar16 + 3);
                  uVar22 = (ulong)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
                  break;
                case 0xce:
                  uVar9 = *(uint *)((long)psVar16 + 1);
                  uVar22 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                                  uVar9 << 0x18);
                  goto LAB_0010aa1f;
                case 0xcf:
                  uVar22 = *(ulong *)((long)psVar16 + 1);
                  uVar22 = uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
                           (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
                           (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 |
                           (uVar22 & 0xff00) << 0x28 | uVar22 << 0x38;
                  goto LAB_0010aa49;
                default:
                  if ((char)bVar2 < '\0') {
LAB_0010aae4:
                    apcStack_88[0] = (code *)0x10aae9;
                    tnt_reply_hdr0_cold_1();
                    goto LAB_0010aae9;
                  }
                  psVar16 = (size_t *)((long)psVar16 + 1);
                  uVar22 = size_00;
                }
              }
              else {
                if (iVar8 != 1) {
                  return -1;
                }
                unaff_R13 = (ulong)(bVar2 - 0xcc);
                switch(unaff_R13) {
                case 0:
                  unaff_R13 = (ulong)*(byte *)((long)psVar16 + 1);
LAB_0010a9e0:
                  psVar16 = (size_t *)((long)psVar16 + 2);
                  break;
                case 1:
                  puVar1 = (ushort *)((long)psVar16 + 1);
                  psVar16 = (size_t *)((long)psVar16 + 3);
                  unaff_R13 = (ulong)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
                  break;
                case 2:
                  uVar9 = *(uint *)((long)psVar16 + 1);
                  unaff_R13 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 |
                                      (uVar9 & 0xff00) << 8 | uVar9 << 0x18);
LAB_0010aa1f:
                  psVar16 = (size_t *)((long)psVar16 + 5);
                  break;
                case 3:
                  uVar3 = *(ulong *)((long)psVar16 + 1);
                  unaff_R13 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                              (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                              (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
                              (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
LAB_0010aa49:
                  psVar16 = (size_t *)((long)psVar16 + 9);
                  break;
                default:
                  if ((char)bVar2 < '\0') goto LAB_0010aaee;
                  psVar16 = (size_t *)((long)psVar16 + 1);
                  unaff_R13 = size_00;
                }
              }
              uVar9 = (int)psVar15 - 1;
              psVar15 = (size_t *)(ulong)uVar9;
              data = (byte **)((ulong)data | 1L << (uVar17 & 0x3f));
            } while (uVar9 != 0);
            uVar23 = (ulong)((uint)uVar23 & 0x7fff);
          }
          if (pvVar21 != (void *)0x0) {
            *(ulong *)((long)pvVar21 + 0x28) = unaff_R13;
            *(ulong *)((long)pvVar21 + 0x20) = uVar23;
            *(ulong *)((long)pvVar21 + 0x30) = uVar22;
            *(byte ***)((long)pvVar21 + 8) = data;
          }
          iVar8 = 0;
          if (in_RCX != (uint *)0x0) {
            *(long *)in_RCX = (long)psVar16 - (long)pbVar19;
            iVar8 = 0;
          }
        }
        return iVar8;
      }
    }
    pcStack_40 = (code *)0x10a774;
    pcVar11 = (char *)tnt_mem_alloc(size_00);
    r->buf = pcVar11;
    r->buf_size = size_00;
    if (pcVar11 != (char *)0x0) {
      pcStack_40 = (code *)0x10a78d;
      sVar10 = (*rcv)(ptr,pcVar11,size_00);
      if (sVar10 != -1) {
        pcStack_40 = (code *)0x10a7a7;
        iVar8 = tnt_reply_hdr0(r,r->buf,r->buf_size,&local_38);
        if (iVar8 == 0) {
          if (size_00 == local_38) {
            return 0;
          }
          pcStack_40 = (code *)0x10a820;
          iVar8 = tnt_reply_body0(r,r->buf + local_38,r->buf_size - local_38,(size_t *)0x0);
          if (iVar8 == 0) {
            return 0;
          }
        }
      }
    }
  }
  if (r->buf != (char *)0x0) {
    pcStack_40 = (code *)0x10a7b9;
    tnt_mem_free(r->buf);
  }
  *(undefined8 *)r = 0;
  r->bitmap = 0;
  r->buf = (char *)0x0;
  r->buf_size = 0;
  r->code = 0;
  r->sync = 0;
  r->schema_id = 0;
  r->error = (char *)0x0;
  r->error_end = (char *)0x0;
  r->data = (char *)0x0;
  r->data_end = (char *)0x0;
  r->metadata = (char *)0x0;
  r->metadata_end = (char *)0x0;
  r->sqlinfo = (char *)0x0;
  r->sqlinfo_end = (char *)0x0;
  r->alloc = r->alloc;
  return -1;
}

Assistant:

int tnt_reply_from(struct tnt_reply *r, tnt_reply_t rcv, void *ptr) {
	/* cleanup, before processing response */
	int alloc = r->alloc;
	memset(r, 0 , sizeof(struct tnt_reply));
	r->alloc = alloc;
	/* reading iproto header */
	char length[TNT_REPLY_IPROTO_HDR_SIZE]; const char *data = (const char *)length;
	if (rcv(ptr, length, sizeof(length)) == -1)
		goto rollback;
	if (mp_typeof(*length) != MP_UINT)
		goto rollback;
	size_t size = mp_decode_uint(&data);
	r->buf = tnt_mem_alloc(size);
	r->buf_size = size;
	if (r->buf == NULL)
		goto rollback;
	if(rcv(ptr, (char *)r->buf, size) == -1)
		goto rollback;
	size_t hdr_length;
	if (tnt_reply_hdr0(r, r->buf, r->buf_size, &hdr_length) != 0)
		goto rollback;
	if (size == (size_t)hdr_length)
		return 0; /* no body */
	if (tnt_reply_body0(r, r->buf + hdr_length, r->buf_size - hdr_length, NULL) != 0)
		goto rollback;

	return 0;
rollback:
	if (r->buf) tnt_mem_free((void *)r->buf);
	alloc = r->alloc;
	memset(r, 0, sizeof(struct tnt_reply));
	r->alloc = alloc;
	return -1;
}